

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::Configurations::parseFromFile
          (Configurations *this,string *configurationFile,Configurations *base)

{
  char *__file;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  stat st;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  __file = (configurationFile->_M_dataplus)._M_p;
  if ((__file != (char *)0x0) && (iVar2 = stat(__file,(stat *)local_1a0), iVar2 == 0)) {
    bVar1 = Parser::parseFromFile(configurationFile,this,base);
    this->m_isFromFile = bVar1;
    return bVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0 + 0x10),"Configuration file [",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1a0 + 0x10),(configurationFile->_M_dataplus)._M_p,
                      configurationFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] does not exist!",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") [(assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] WITH MESSAGE \"",0x10);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return false;
}

Assistant:

bool Configurations::parseFromFile(const std::string& configurationFile, Configurations* base) {
  // We initial assertion with true because if we have assertion diabled, we want to pass this
  // check and if assertion is enabled we will have values re-assigned any way.
  bool assertionPassed = true;
  ELPP_ASSERT((assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true,
              "Configuration file [" << configurationFile << "] does not exist!");
  if (!assertionPassed) {
    return false;
  }
  bool success = Parser::parseFromFile(configurationFile, this, base);
  m_isFromFile = success;
  return success;
}